

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O0

void __thiscall diff_match_patch_test::testPatchFromText(diff_match_patch_test *this)

{
  bool value;
  wstring ex;
  wstring local_4d0;
  allocator<wchar_t> local_4a9;
  wstring local_4a8 [32];
  deque<Patch,_std::allocator<Patch>_> local_488;
  allocator<wchar_t> local_431;
  wstring local_430 [32];
  deque<Patch,_std::allocator<Patch>_> local_410;
  wstring local_3c0;
  allocator<wchar_t> local_399;
  wstring local_398;
  allocator<wchar_t> local_371;
  wstring local_370;
  allocator<wchar_t> local_349;
  wstring local_348 [32];
  deque<Patch,_std::allocator<Patch>_> local_328;
  wstring local_2d8;
  allocator<wchar_t> local_2b1;
  wstring local_2b0;
  allocator<wchar_t> local_289;
  wstring local_288;
  allocator<wchar_t> local_261;
  wstring local_260 [32];
  deque<Patch,_std::allocator<Patch>_> local_240;
  wstring local_1f0;
  allocator<wchar_t> local_1c9;
  wstring local_1c8;
  allocator<wchar_t> local_1a1;
  wstring local_1a0;
  deque<Patch,_std::allocator<Patch>_> local_180;
  wstring local_130;
  allocator<wchar_t> local_109;
  wstring local_108;
  allocator<wchar_t> local_e1;
  undefined1 local_e0 [8];
  wstring strp;
  wstring local_b8 [32];
  deque<Patch,_std::allocator<Patch>_> local_98;
  allocator<wchar_t> local_31;
  wstring local_30;
  diff_match_patch_test *local_10;
  diff_match_patch_test *this_local;
  
  local_10 = this;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_30,L"patch_fromText: #0.",&local_31);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (local_b8,L"",(allocator<wchar_t> *)((long)&strp.field_2 + 0xf));
  diff_match_patch::patch_fromText((wstring *)&local_98);
  value = std::deque<Patch,_std::allocator<Patch>_>::empty(&local_98);
  assertTrue(this,&local_30,value);
  std::deque<Patch,_std::allocator<Patch>_>::~deque(&local_98);
  std::__cxx11::wstring::~wstring(local_b8);
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)((long)&strp.field_2 + 0xf));
  std::__cxx11::wstring::~wstring((wstring *)&local_30);
  std::allocator<wchar_t>::~allocator(&local_31);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)local_e0,
             L"@@ -21,18 +22,17 @@\n jump\n-s\n+ed\n  over \n-the\n+a\n %0Alaz\n",&local_e1);
  std::allocator<wchar_t>::~allocator(&local_e1);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_108,L"patch_fromText: #1.",&local_109);
  diff_match_patch::patch_fromText((wstring *)&local_180);
  std::deque<Patch,_std::allocator<Patch>_>::operator[](&local_180,0);
  Patch::toString_abi_cxx11_();
  assertEquals(this,&local_108,(wstring *)local_e0,&local_130);
  std::__cxx11::wstring::~wstring((wstring *)&local_130);
  std::deque<Patch,_std::allocator<Patch>_>::~deque(&local_180);
  std::__cxx11::wstring::~wstring((wstring *)&local_108);
  std::allocator<wchar_t>::~allocator(&local_109);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_1a0,L"patch_fromText: #2.",&local_1a1);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_1c8,L"@@ -1 +1 @@\n-a\n+b\n",&local_1c9);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (local_260,L"@@ -1 +1 @@\n-a\n+b\n",&local_261);
  diff_match_patch::patch_fromText((wstring *)&local_240);
  std::deque<Patch,_std::allocator<Patch>_>::operator[](&local_240,0);
  Patch::toString_abi_cxx11_();
  assertEquals(this,&local_1a0,&local_1c8,&local_1f0);
  std::__cxx11::wstring::~wstring((wstring *)&local_1f0);
  std::deque<Patch,_std::allocator<Patch>_>::~deque(&local_240);
  std::__cxx11::wstring::~wstring(local_260);
  std::allocator<wchar_t>::~allocator(&local_261);
  std::__cxx11::wstring::~wstring((wstring *)&local_1c8);
  std::allocator<wchar_t>::~allocator(&local_1c9);
  std::__cxx11::wstring::~wstring((wstring *)&local_1a0);
  std::allocator<wchar_t>::~allocator(&local_1a1);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_288,L"patch_fromText: #3.",&local_289);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_2b0,L"@@ -1,3 +0,0 @@\n-abc\n",&local_2b1);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (local_348,L"@@ -1,3 +0,0 @@\n-abc\n",&local_349);
  diff_match_patch::patch_fromText((wstring *)&local_328);
  std::deque<Patch,_std::allocator<Patch>_>::operator[](&local_328,0);
  Patch::toString_abi_cxx11_();
  assertEquals(this,&local_288,&local_2b0,&local_2d8);
  std::__cxx11::wstring::~wstring((wstring *)&local_2d8);
  std::deque<Patch,_std::allocator<Patch>_>::~deque(&local_328);
  std::__cxx11::wstring::~wstring(local_348);
  std::allocator<wchar_t>::~allocator(&local_349);
  std::__cxx11::wstring::~wstring((wstring *)&local_2b0);
  std::allocator<wchar_t>::~allocator(&local_2b1);
  std::__cxx11::wstring::~wstring((wstring *)&local_288);
  std::allocator<wchar_t>::~allocator(&local_289);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_370,L"patch_fromText: #4.",&local_371);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_398,L"@@ -0,0 +1,3 @@\n+abc\n",&local_399);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (local_430,L"@@ -0,0 +1,3 @@\n+abc\n",&local_431);
  diff_match_patch::patch_fromText((wstring *)&local_410);
  std::deque<Patch,_std::allocator<Patch>_>::operator[](&local_410,0);
  Patch::toString_abi_cxx11_();
  assertEquals(this,&local_370,&local_398,&local_3c0);
  std::__cxx11::wstring::~wstring((wstring *)&local_3c0);
  std::deque<Patch,_std::allocator<Patch>_>::~deque(&local_410);
  std::__cxx11::wstring::~wstring(local_430);
  std::allocator<wchar_t>::~allocator(&local_431);
  std::__cxx11::wstring::~wstring((wstring *)&local_398);
  std::allocator<wchar_t>::~allocator(&local_399);
  std::__cxx11::wstring::~wstring((wstring *)&local_370);
  std::allocator<wchar_t>::~allocator(&local_371);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_4a8,L"Bad\nPatch\n",&local_4a9);
  diff_match_patch::patch_fromText((wstring *)&local_488);
  std::deque<Patch,_std::allocator<Patch>_>::~deque(&local_488);
  std::__cxx11::wstring::~wstring(local_4a8);
  std::allocator<wchar_t>::~allocator(&local_4a9);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_4d0,L"patch_fromText: #5.",
             (allocator<wchar_t> *)((long)&ex.field_2 + 0xf));
  assertFalse(this,&local_4d0,true);
  std::__cxx11::wstring::~wstring((wstring *)&local_4d0);
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)((long)&ex.field_2 + 0xf));
  std::__cxx11::wstring::~wstring((wstring *)local_e0);
  return;
}

Assistant:

void diff_match_patch_test::testPatchFromText() {
  assertTrue(L"patch_fromText: #0.", dmp.patch_fromText(L"").empty());

  std::wstring strp = L"@@ -21,18 +22,17 @@\n jump\n-s\n+ed\n  over \n-the\n+a\n %0Alaz\n";
  assertEquals(L"patch_fromText: #1.", strp, dmp.patch_fromText(strp)[0].toString());

  assertEquals(L"patch_fromText: #2.", L"@@ -1 +1 @@\n-a\n+b\n", dmp.patch_fromText(L"@@ -1 +1 @@\n-a\n+b\n")[0].toString());

  assertEquals(L"patch_fromText: #3.", L"@@ -1,3 +0,0 @@\n-abc\n", dmp.patch_fromText(L"@@ -1,3 +0,0 @@\n-abc\n")[0].toString());

  assertEquals(L"patch_fromText: #4.", L"@@ -0,0 +1,3 @@\n+abc\n", dmp.patch_fromText(L"@@ -0,0 +1,3 @@\n+abc\n")[0].toString());

  // Generates error.
  try {
    dmp.patch_fromText(L"Bad\nPatch\n");
    assertFalse(L"patch_fromText: #5.", true);
  } catch (std::wstring ex) {
    // Exception expected.
  }
}